

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.cpp
# Opt level: O0

u64 load_4(uchar *in)

{
  u64 result;
  uchar *in_local;
  
  return (ulong)*(uint *)in;
}

Assistant:

static u64 load_4(const unsigned char *in) {
    u64 result;

    result = (u64) in[0];
    result |= ((u64) in[1]) << 8;
    result |= ((u64) in[2]) << 16;
    result |= ((u64) in[3]) << 24;
    
    return result;
}